

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateCropLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  string *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_01;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_02;
  int iVar1;
  bool bVar2;
  Type *pTVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  undefined1 *puVar6;
  Result *_result;
  _Rb_tree_header *p_Var7;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  validateInputCount(__return_storage_ptr__,layer,1,2);
  bVar2 = Result::good(__return_storage_ptr__);
  if (!bVar2) {
    return __return_storage_ptr__;
  }
  this_00 = &__return_storage_ptr__->m_message;
  std::__cxx11::string::~string((string *)this_00);
  validateOutputCount(__return_storage_ptr__,layer,1,1);
  bVar2 = Result::good(__return_storage_ptr__);
  if (!bVar2) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::~string((string *)this_00);
  if (this->ndArrayInterpretation == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Crop",(allocator<char> *)&err);
    this_01 = &this->blobNameToRank;
    validateInputOutputRankEquality(__return_storage_ptr__,layer,&local_50,this_01);
    std::__cxx11::string::~string((string *)&local_50);
    bVar2 = Result::good(__return_storage_ptr__);
    if (!bVar2) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::~string((string *)this_00);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&err,"Crop",(allocator<char> *)&local_b0);
    validateRankCount(__return_storage_ptr__,layer,&err,3,-1,this_01);
    std::__cxx11::string::~string((string *)&err);
    bVar2 = Result::good(__return_storage_ptr__);
    if (!bVar2) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::~string((string *)this_00);
    if (1 < (layer->input_).super_RepeatedPtrFieldBase.current_size_) {
      this_02 = &layer->input_;
      pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_02->super_RepeatedPtrFieldBase,0);
      iVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::find(&this_01->_M_t,pTVar3);
      p_Var7 = &(this->blobNameToRank)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)iVar4._M_node != p_Var7) {
        pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                           (&this_02->super_RepeatedPtrFieldBase,1);
        iVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::find(&this_01->_M_t,pTVar3);
        if ((_Rb_tree_header *)iVar4._M_node != p_Var7) {
          pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&this_02->super_RepeatedPtrFieldBase,0);
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::at(this_01,pTVar3);
          iVar1 = *pmVar5;
          pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&this_02->super_RepeatedPtrFieldBase,1);
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::at(this_01,pTVar3);
          if (iVar1 != *pmVar5) {
            err._M_dataplus._M_p = (pointer)&err.field_2;
            err._M_string_length = 0;
            err.field_2._M_local_buf[0] = '\0';
            std::__cxx11::string::string
                      ((string *)&local_90,
                       (string *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
            std::operator+(&local_d0,"Layer \'",&local_90);
            std::operator+(&local_b0,&local_d0,
                           "\' of type \'Crop\' expects equal ranks for its inputs, but they are not equal."
                          );
            std::__cxx11::string::operator=((string *)&err,(string *)&local_b0);
            std::__cxx11::string::~string((string *)&local_b0);
            std::__cxx11::string::~string((string *)&local_d0);
            std::__cxx11::string::~string((string *)&local_90);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
            goto LAB_002a9ea3;
          }
        }
      }
    }
  }
  if (layer->_oneof_case_[0] == 0xbe) {
    puVar6 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar6 = Specification::_CropLayerParams_default_instance_;
  }
  if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ == 1) {
    puVar6 = (undefined1 *)((BatchnormLayerParams *)puVar6)->variance_;
    if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
      puVar6 = Specification::_BorderAmounts_default_instance_;
    }
    if (*(int *)&(((WeightParams *)puVar6)->floatvalue_).arena_or_elements_ == 2) {
LAB_002a9d39:
      Result::Result(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    std::operator+(&local_90,"cropAmounts parameter for the crop layer \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    std::operator+(&local_d0,&local_90,"\' is of length ");
    if (layer->_oneof_case_[0] == 0xbe) {
      puVar6 = *(undefined1 **)&layer->layer_;
    }
    else {
      puVar6 = Specification::_CropLayerParams_default_instance_;
    }
    puVar6 = (undefined1 *)((BatchnormLayerParams *)puVar6)->variance_;
    if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
      puVar6 = Specification::_BorderAmounts_default_instance_;
    }
    std::__cxx11::to_string
              (&local_70,*(int *)&(((WeightParams *)puVar6)->floatvalue_).arena_or_elements_);
    std::operator+(&local_b0,&local_d0,&local_70);
    std::operator+(&err,&local_b0," but requires exactly two crop constraints (for X,Y axes).");
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_90);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
  }
  else {
    if ((((ConvolutionLayerParams *)puVar6)->kernelsize_).current_size_ == 2) goto LAB_002a9d39;
    std::operator+(&local_90,"Offset parameter for the crop layer \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    std::operator+(&local_d0,&local_90,"\' is of length ");
    if (layer->_oneof_case_[0] == 0xbe) {
      puVar6 = *(undefined1 **)&layer->layer_;
    }
    else {
      puVar6 = Specification::_CropLayerParams_default_instance_;
    }
    std::__cxx11::to_string
              (&local_70,(((ConvolutionLayerParams *)puVar6)->kernelsize_).current_size_);
    std::operator+(&local_b0,&local_d0,&local_70);
    std::operator+(&err,&local_b0," but requires exactly two offsets (for X,Y axes).");
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_90);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
  }
LAB_002a9ea3:
  std::__cxx11::string::~string((string *)&err);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateCropLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 2));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Crop", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "Crop", 3, -1, blobNameToRank));

        if (layer.input_size() > 1) {
            if (blobNameToRank.find(layer.input(0)) != blobNameToRank.end() &&
                blobNameToRank.find(layer.input(1)) != blobNameToRank.end()) {
                if (blobNameToRank.at(layer.input(0)) != blobNameToRank.at(layer.input(1))) {
                    std::string err;
                    err = "Layer '" + std::string(layer.name()) + "' of type 'Crop' expects equal ranks for its inputs, but they are not equal.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }
        }
    }

    if (layer.input_size() == 1) {
        // check the border amounts
        if (layer.crop().cropamounts().borderamounts_size() != 2) {
            std::string err = "cropAmounts parameter for the crop layer '" + layer.name() + "' is of length " + std::to_string(layer.crop().cropamounts().borderamounts_size()) + " but requires exactly two crop constraints (for X,Y axes).";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    else { // size == 2 checked above
        // offset must be size 2
        if (layer.crop().offset_size() != 2)  {
            std::string err = "Offset parameter for the crop layer '" + layer.name() + "' is of length " + std::to_string(layer.crop().offset_size()) + " but requires exactly two offsets (for X,Y axes).";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    return Result();
}